

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage11_sse2(__m128i *output,__m128i *x)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i _in1_27;
  __m128i _in0_27;
  __m128i _in1_26;
  __m128i _in0_26;
  __m128i _in1_25;
  __m128i _in0_25;
  __m128i _in1_24;
  __m128i _in0_24;
  __m128i _in1_23;
  __m128i _in0_23;
  __m128i _in1_22;
  __m128i _in0_22;
  __m128i _in1_21;
  __m128i _in0_21;
  __m128i _in1_20;
  __m128i _in0_20;
  __m128i _in1_19;
  __m128i _in0_19;
  __m128i _in1_18;
  __m128i _in0_18;
  __m128i _in1_17;
  __m128i _in0_17;
  __m128i _in1_16;
  __m128i _in0_16;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in1_31;
  __m128i _in0_31;
  __m128i _in1_30;
  __m128i _in0_30;
  __m128i _in1_29;
  __m128i _in0_29;
  __m128i _in1_28;
  __m128i _in0_28;
  
  auVar3 = *in_RSI;
  auVar1 = in_RSI[0x3f];
  auVar2 = paddsw(*in_RSI,in_RSI[0x3f]);
  *in_RDI = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x3f] = auVar3;
  auVar3 = in_RSI[1];
  auVar1 = in_RSI[0x3e];
  auVar2 = paddsw(in_RSI[1],in_RSI[0x3e]);
  in_RDI[1] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x3e] = auVar3;
  auVar3 = in_RSI[2];
  auVar1 = in_RSI[0x3d];
  auVar2 = paddsw(in_RSI[2],in_RSI[0x3d]);
  in_RDI[2] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x3d] = auVar3;
  auVar3 = in_RSI[3];
  auVar1 = in_RSI[0x3c];
  auVar2 = paddsw(in_RSI[3],in_RSI[0x3c]);
  in_RDI[3] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x3c] = auVar3;
  auVar3 = in_RSI[4];
  auVar1 = in_RSI[0x3b];
  auVar2 = paddsw(in_RSI[4],in_RSI[0x3b]);
  in_RDI[4] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x3b] = auVar3;
  auVar3 = in_RSI[5];
  auVar1 = in_RSI[0x3a];
  auVar2 = paddsw(in_RSI[5],in_RSI[0x3a]);
  in_RDI[5] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x3a] = auVar3;
  auVar3 = in_RSI[6];
  auVar1 = in_RSI[0x39];
  auVar2 = paddsw(in_RSI[6],in_RSI[0x39]);
  in_RDI[6] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x39] = auVar3;
  auVar3 = in_RSI[7];
  auVar1 = in_RSI[0x38];
  auVar2 = paddsw(in_RSI[7],in_RSI[0x38]);
  in_RDI[7] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x38] = auVar3;
  auVar3 = in_RSI[8];
  auVar1 = in_RSI[0x37];
  auVar2 = paddsw(in_RSI[8],in_RSI[0x37]);
  in_RDI[8] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x37] = auVar3;
  auVar3 = in_RSI[9];
  auVar1 = in_RSI[0x36];
  auVar2 = paddsw(in_RSI[9],in_RSI[0x36]);
  in_RDI[9] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x36] = auVar3;
  auVar3 = in_RSI[10];
  auVar1 = in_RSI[0x35];
  auVar2 = paddsw(in_RSI[10],in_RSI[0x35]);
  in_RDI[10] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x35] = auVar3;
  auVar3 = in_RSI[0xb];
  auVar1 = in_RSI[0x34];
  auVar2 = paddsw(in_RSI[0xb],in_RSI[0x34]);
  in_RDI[0xb] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x34] = auVar3;
  auVar3 = in_RSI[0xc];
  auVar1 = in_RSI[0x33];
  auVar2 = paddsw(in_RSI[0xc],in_RSI[0x33]);
  in_RDI[0xc] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x33] = auVar3;
  auVar3 = in_RSI[0xd];
  auVar1 = in_RSI[0x32];
  auVar2 = paddsw(in_RSI[0xd],in_RSI[0x32]);
  in_RDI[0xd] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x32] = auVar3;
  auVar3 = in_RSI[0xe];
  auVar1 = in_RSI[0x31];
  auVar2 = paddsw(in_RSI[0xe],in_RSI[0x31]);
  in_RDI[0xe] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x31] = auVar3;
  auVar3 = in_RSI[0xf];
  auVar1 = in_RSI[0x30];
  auVar2 = paddsw(in_RSI[0xf],in_RSI[0x30]);
  in_RDI[0xf] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x30] = auVar3;
  auVar3 = in_RSI[0x10];
  auVar1 = in_RSI[0x2f];
  auVar2 = paddsw(in_RSI[0x10],in_RSI[0x2f]);
  in_RDI[0x10] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x2f] = auVar3;
  auVar3 = in_RSI[0x11];
  auVar1 = in_RSI[0x2e];
  auVar2 = paddsw(in_RSI[0x11],in_RSI[0x2e]);
  in_RDI[0x11] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x2e] = auVar3;
  auVar3 = in_RSI[0x12];
  auVar1 = in_RSI[0x2d];
  auVar2 = paddsw(in_RSI[0x12],in_RSI[0x2d]);
  in_RDI[0x12] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x2d] = auVar3;
  auVar3 = in_RSI[0x13];
  auVar1 = in_RSI[0x2c];
  auVar2 = paddsw(in_RSI[0x13],in_RSI[0x2c]);
  in_RDI[0x13] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x2c] = auVar3;
  auVar3 = in_RSI[0x14];
  auVar1 = in_RSI[0x2b];
  auVar2 = paddsw(in_RSI[0x14],in_RSI[0x2b]);
  in_RDI[0x14] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x2b] = auVar3;
  auVar3 = in_RSI[0x15];
  auVar1 = in_RSI[0x2a];
  auVar2 = paddsw(in_RSI[0x15],in_RSI[0x2a]);
  in_RDI[0x15] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x2a] = auVar3;
  auVar3 = in_RSI[0x16];
  auVar1 = in_RSI[0x29];
  auVar2 = paddsw(in_RSI[0x16],in_RSI[0x29]);
  in_RDI[0x16] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x29] = auVar3;
  auVar3 = in_RSI[0x17];
  auVar1 = in_RSI[0x28];
  auVar2 = paddsw(in_RSI[0x17],in_RSI[0x28]);
  in_RDI[0x17] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x28] = auVar3;
  auVar3 = in_RSI[0x18];
  auVar1 = in_RSI[0x27];
  auVar2 = paddsw(in_RSI[0x18],in_RSI[0x27]);
  in_RDI[0x18] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x27] = auVar3;
  auVar3 = in_RSI[0x19];
  auVar1 = in_RSI[0x26];
  auVar2 = paddsw(in_RSI[0x19],in_RSI[0x26]);
  in_RDI[0x19] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x26] = auVar3;
  auVar3 = in_RSI[0x1a];
  auVar1 = in_RSI[0x25];
  auVar2 = paddsw(in_RSI[0x1a],in_RSI[0x25]);
  in_RDI[0x1a] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x25] = auVar3;
  auVar3 = in_RSI[0x1b];
  auVar1 = in_RSI[0x24];
  auVar2 = paddsw(in_RSI[0x1b],in_RSI[0x24]);
  in_RDI[0x1b] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x24] = auVar3;
  auVar3 = in_RSI[0x1c];
  auVar1 = in_RSI[0x23];
  auVar2 = paddsw(in_RSI[0x1c],in_RSI[0x23]);
  in_RDI[0x1c] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x23] = auVar3;
  auVar3 = in_RSI[0x1d];
  auVar1 = in_RSI[0x22];
  auVar2 = paddsw(in_RSI[0x1d],in_RSI[0x22]);
  in_RDI[0x1d] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x22] = auVar3;
  auVar3 = in_RSI[0x1e];
  auVar1 = in_RSI[0x21];
  auVar2 = paddsw(in_RSI[0x1e],in_RSI[0x21]);
  in_RDI[0x1e] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x21] = auVar3;
  auVar3 = in_RSI[0x1f];
  auVar1 = in_RSI[0x20];
  auVar2 = paddsw(in_RSI[0x1f],in_RSI[0x20]);
  in_RDI[0x1f] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0x20] = auVar3;
  return;
}

Assistant:

static inline void idct64_stage11_sse2(__m128i *output, __m128i *x) {
  btf_16_adds_subs_out_sse2(output[0], output[63], x[0], x[63]);
  btf_16_adds_subs_out_sse2(output[1], output[62], x[1], x[62]);
  btf_16_adds_subs_out_sse2(output[2], output[61], x[2], x[61]);
  btf_16_adds_subs_out_sse2(output[3], output[60], x[3], x[60]);
  btf_16_adds_subs_out_sse2(output[4], output[59], x[4], x[59]);
  btf_16_adds_subs_out_sse2(output[5], output[58], x[5], x[58]);
  btf_16_adds_subs_out_sse2(output[6], output[57], x[6], x[57]);
  btf_16_adds_subs_out_sse2(output[7], output[56], x[7], x[56]);
  btf_16_adds_subs_out_sse2(output[8], output[55], x[8], x[55]);
  btf_16_adds_subs_out_sse2(output[9], output[54], x[9], x[54]);
  btf_16_adds_subs_out_sse2(output[10], output[53], x[10], x[53]);
  btf_16_adds_subs_out_sse2(output[11], output[52], x[11], x[52]);
  btf_16_adds_subs_out_sse2(output[12], output[51], x[12], x[51]);
  btf_16_adds_subs_out_sse2(output[13], output[50], x[13], x[50]);
  btf_16_adds_subs_out_sse2(output[14], output[49], x[14], x[49]);
  btf_16_adds_subs_out_sse2(output[15], output[48], x[15], x[48]);
  btf_16_adds_subs_out_sse2(output[16], output[47], x[16], x[47]);
  btf_16_adds_subs_out_sse2(output[17], output[46], x[17], x[46]);
  btf_16_adds_subs_out_sse2(output[18], output[45], x[18], x[45]);
  btf_16_adds_subs_out_sse2(output[19], output[44], x[19], x[44]);
  btf_16_adds_subs_out_sse2(output[20], output[43], x[20], x[43]);
  btf_16_adds_subs_out_sse2(output[21], output[42], x[21], x[42]);
  btf_16_adds_subs_out_sse2(output[22], output[41], x[22], x[41]);
  btf_16_adds_subs_out_sse2(output[23], output[40], x[23], x[40]);
  btf_16_adds_subs_out_sse2(output[24], output[39], x[24], x[39]);
  btf_16_adds_subs_out_sse2(output[25], output[38], x[25], x[38]);
  btf_16_adds_subs_out_sse2(output[26], output[37], x[26], x[37]);
  btf_16_adds_subs_out_sse2(output[27], output[36], x[27], x[36]);
  btf_16_adds_subs_out_sse2(output[28], output[35], x[28], x[35]);
  btf_16_adds_subs_out_sse2(output[29], output[34], x[29], x[34]);
  btf_16_adds_subs_out_sse2(output[30], output[33], x[30], x[33]);
  btf_16_adds_subs_out_sse2(output[31], output[32], x[31], x[32]);
}